

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::ConstructSourceFileFlags(cmGeneratorTarget *this)

{
  size_type sVar1;
  int iVar2;
  cmValue cVar3;
  mapped_type *pmVar4;
  string *relFile;
  _Alloc_hider _Var5;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  cmSourceFile *sf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relFiles;
  cmSourceFile *local_58;
  string local_50;
  
  if (this->SourceFileFlagsConstructed == false) {
    this->SourceFileFlagsConstructed = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"PUBLIC_HEADER",(allocator<char> *)&local_58);
    cVar3 = GetProperty(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (cVar3.Value != (string *)0x0) {
      arg._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar3.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_50,arg,false);
      sVar1 = local_50._M_string_length;
      for (_Var5._M_p = local_50._M_dataplus._M_p; _Var5._M_p != (pointer)sVar1;
          _Var5._M_p = _Var5._M_p + 0x20) {
        local_58 = cmMakefile::GetSource(this->Makefile,(string *)_Var5._M_p,Ambiguous);
        if (local_58 != (cmSourceFile *)0x0) {
          pmVar4 = std::
                   map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                   ::operator[](&this->SourceFlagsMap,&local_58);
          pmVar4->MacFolder = "Headers";
          pmVar4->Type = SourceFileTypePublicHeader;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_50);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"PRIVATE_HEADER",(allocator<char> *)&local_58);
    cVar3 = GetProperty(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (cVar3.Value != (string *)0x0) {
      arg_00._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
      arg_00._M_len = (cVar3.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_50,arg_00,false);
      sVar1 = local_50._M_string_length;
      for (_Var5._M_p = local_50._M_dataplus._M_p; _Var5._M_p != (pointer)sVar1;
          _Var5._M_p = _Var5._M_p + 0x20) {
        local_58 = cmMakefile::GetSource(this->Makefile,(string *)_Var5._M_p,Ambiguous);
        if (local_58 != (cmSourceFile *)0x0) {
          pmVar4 = std::
                   map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                   ::operator[](&this->SourceFlagsMap,&local_58);
          pmVar4->MacFolder = "PrivateHeaders";
          pmVar4->Type = SourceFileTypePrivateHeader;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_50);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"RESOURCE",(allocator<char> *)&local_58);
    cVar3 = GetProperty(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (cVar3.Value != (string *)0x0) {
      arg_01._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
      arg_01._M_len = (cVar3.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_50,arg_01,false);
      for (_Var5._M_p = local_50._M_dataplus._M_p; _Var5._M_p != (pointer)local_50._M_string_length;
          _Var5._M_p = _Var5._M_p + 0x20) {
        local_58 = cmMakefile::GetSource(this->Makefile,(string *)_Var5._M_p,Ambiguous);
        if (local_58 != (cmSourceFile *)0x0) {
          pmVar4 = std::
                   map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                   ::operator[](&this->SourceFlagsMap,&local_58);
          pmVar4->MacFolder = "";
          iVar2 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x30])
                            (this->GlobalGenerator,this->Makefile);
          if ((char)iVar2 == '\0') {
            pmVar4->MacFolder = "Resources";
          }
          pmVar4->Type = SourceFileTypeResource;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_50);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::ConstructSourceFileFlags() const
{
  if (this->SourceFileFlagsConstructed) {
    return;
  }
  this->SourceFileFlagsConstructed = true;

  // Process public headers to mark the source files.
  if (cmValue files = this->GetProperty("PUBLIC_HEADER")) {
    std::vector<std::string> relFiles = cmExpandedList(*files);
    for (std::string const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "Headers";
        flags.Type = cmGeneratorTarget::SourceFileTypePublicHeader;
      }
    }
  }

  // Process private headers after public headers so that they take
  // precedence if a file is listed in both.
  if (cmValue files = this->GetProperty("PRIVATE_HEADER")) {
    std::vector<std::string> relFiles = cmExpandedList(*files);
    for (std::string const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "PrivateHeaders";
        flags.Type = cmGeneratorTarget::SourceFileTypePrivateHeader;
      }
    }
  }

  // Mark sources listed as resources.
  if (cmValue files = this->GetProperty("RESOURCE")) {
    std::vector<std::string> relFiles = cmExpandedList(*files);
    for (std::string const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "";
        if (!this->GlobalGenerator->ShouldStripResourcePath(this->Makefile)) {
          flags.MacFolder = "Resources";
        }
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
      }
    }
  }
}